

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglpixeltransferoptions.cpp
# Opt level: O0

void __thiscall
QOpenGLPixelTransferOptions::setSkipImages(QOpenGLPixelTransferOptions *this,int skipImages)

{
  QOpenGLPixelTransferOptionsData *pQVar1;
  int in_ESI;
  
  pQVar1 = QSharedDataPointer<QOpenGLPixelTransferOptionsData>::operator->
                     ((QSharedDataPointer<QOpenGLPixelTransferOptionsData> *)CONCAT44(in_ESI,in_ESI)
                     );
  pQVar1->skipImages = in_ESI;
  return;
}

Assistant:

void QOpenGLPixelTransferOptions::setSkipImages(int skipImages)
{
    data->skipImages = skipImages;
}